

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_vec3_float(void *a,float **vertices,trico_stream_type st)

{
  trico_stream_type tVar1;
  ssize_t sVar2;
  uint32_t local_6c;
  float *pfStack_68;
  uint32_t nr_of_floats_z;
  float *decompressed_z;
  float *pfStack_58;
  uint32_t nr_of_floats_y;
  float *decompressed_y;
  float *pfStack_48;
  uint32_t nr_of_floats_x;
  float *decompressed_x;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_vertices;
  trico_archive *arch;
  float **ppfStack_20;
  trico_stream_type st_local;
  float **vertices_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch._4_4_ = st;
  ppfStack_20 = vertices;
  vertices_local = (float **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == arch._4_4_) {
    sVar2 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar2 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar2 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        decompressed_x = (float *)trico_malloc((ulong)(uint)compressed);
        sVar2 = read((int)decompressed_x,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar2 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          trico_decompress((uint32_t *)((long)&decompressed_y + 4),&stack0xffffffffffffffb8,
                           (uint8_t *)decompressed_x);
          sVar2 = read((int)&compressed,(void *)0x4,1);
          if ((int)sVar2 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            decompressed_x = (float *)trico_realloc(decompressed_x,(ulong)(uint)compressed);
            sVar2 = read((int)decompressed_x,(void *)0x1,(ulong)(uint)compressed);
            if ((int)sVar2 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              trico_decompress((uint32_t *)((long)&decompressed_z + 4),&stack0xffffffffffffffa8,
                               (uint8_t *)decompressed_x);
              sVar2 = read((int)&compressed,(void *)0x4,1);
              if ((int)sVar2 == 0) {
                a_local._4_4_ = 0;
              }
              else {
                decompressed_x = (float *)trico_realloc(decompressed_x,(ulong)(uint)compressed);
                sVar2 = read((int)decompressed_x,(void *)0x1,(ulong)(uint)compressed);
                if ((int)sVar2 == 0) {
                  a_local._4_4_ = 0;
                }
                else {
                  trico_decompress(&local_6c,&stack0xffffffffffffff98,(uint8_t *)decompressed_x);
                  trico_free(decompressed_x);
                  if (decompressed_y._4_4_ != compressed._4_4_) {
                    __assert_fail("nr_of_floats_x == nr_vertices",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x3d6,
                                  "int trico_read_vec3_float(void *, float **, enum trico_stream_type)"
                                 );
                  }
                  if (decompressed_y._4_4_ != decompressed_z._4_4_) {
                    __assert_fail("nr_of_floats_x == nr_of_floats_y",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x3d7,
                                  "int trico_read_vec3_float(void *, float **, enum trico_stream_type)"
                                 );
                  }
                  if (decompressed_y._4_4_ != local_6c) {
                    __assert_fail("nr_of_floats_x == nr_of_floats_z",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x3d8,
                                  "int trico_read_vec3_float(void *, float **, enum trico_stream_type)"
                                 );
                  }
                  if (ppfStack_20 != (float **)0x0) {
                    trico_transpose_xyz_soa_to_aos
                              (ppfStack_20,pfStack_48,pfStack_58,pfStack_68,compressed._4_4_);
                  }
                  trico_free(pfStack_48);
                  trico_free(pfStack_58);
                  trico_free(pfStack_68);
                  read_next_stream_type(_nr_of_compressed_bytes);
                  a_local._4_4_ = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int trico_read_vec3_float(void* a, float** vertices, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_vertices;
  if (!read(&nr_vertices, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_x;
  uint32_t nr_of_floats_x;
  trico_decompress(&nr_of_floats_x, &decompressed_x, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_y;
  uint32_t nr_of_floats_y;
  trico_decompress(&nr_of_floats_y, &decompressed_y, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_z;
  uint32_t nr_of_floats_z;
  trico_decompress(&nr_of_floats_z, &decompressed_z, (const uint8_t*)compressed);
  trico_free(compressed);

  assert(nr_of_floats_x == nr_vertices);
  assert(nr_of_floats_x == nr_of_floats_y);
  assert(nr_of_floats_x == nr_of_floats_z);

  if (vertices != NULL)
    trico_transpose_xyz_soa_to_aos(vertices, decompressed_x, decompressed_y, decompressed_z, nr_vertices);

  trico_free(decompressed_x);
  trico_free(decompressed_y);
  trico_free(decompressed_z);

  read_next_stream_type(arch);

  return 1;
  }